

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::HandleMissingTarget
          (cmExportBuildFileGenerator *this,string *link_libs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets,cmGeneratorTarget *depender,cmGeneratorTarget *dependee)

{
  cmExportBuildFileGenerator *this_00;
  cmLocalGenerator *pcVar1;
  int occurrences;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namespaces;
  string missingTarget;
  string sStack_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  value_type local_70;
  string local_50;
  
  if ((this->super_cmExportFileGenerator).AppendMode == false) {
    this_00 = (cmExportBuildFileGenerator *)cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    std::__cxx11::string::string((string *)&sStack_a8,(string *)this_00);
    pcVar1 = cmGeneratorTarget::GetLocalGenerator(dependee);
    FindNamespaces(&local_88,this_00,pcVar1->GlobalGenerator,&sStack_a8);
    occurrences = (int)((ulong)((long)local_88.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_88.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
    if (occurrences == 1) {
      std::__cxx11::string::string
                ((string *)&local_70,
                 (string *)
                 local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_50,dependee);
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((string *)link_libs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(missingTargets,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      ComplainAboutMissingTarget(this,depender,dependee,occurrences);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::__cxx11::string::~string((string *)&sStack_a8);
    if (occurrences == 1) {
      return;
    }
  }
  std::__cxx11::string::append((string *)link_libs);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&sStack_a8,dependee);
  std::__cxx11::string::append((string *)link_libs);
  std::__cxx11::string::~string((string *)&sStack_a8);
  return;
}

Assistant:

void cmExportBuildFileGenerator::HandleMissingTarget(
  std::string& link_libs, std::vector<std::string>& missingTargets,
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee)
{
  // The target is not in the export.
  if (!this->AppendMode) {
    const std::string name = dependee->GetName();
    cmGlobalGenerator* gg =
      dependee->GetLocalGenerator()->GetGlobalGenerator();
    std::vector<std::string> namespaces = this->FindNamespaces(gg, name);

    int targetOccurrences = (int)namespaces.size();
    if (targetOccurrences == 1) {
      std::string missingTarget = namespaces[0];

      missingTarget += dependee->GetExportName();
      link_libs += missingTarget;
      missingTargets.push_back(missingTarget);
      return;
    }
    // We are not appending, so all exported targets should be
    // known here.  This is probably user-error.
    this->ComplainAboutMissingTarget(depender, dependee, targetOccurrences);
  }
  // Assume the target will be exported by another command.
  // Append it with the export namespace.
  link_libs += this->Namespace;
  link_libs += dependee->GetExportName();
}